

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter::CurrentAndTwoMoreIter
          (CurrentAndTwoMoreIter *this,base_t *args)

{
  _List_iterator<cmExpandedCommandArgument> _Var1;
  
  _Var1._M_node =
       (args->
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl._M_node.super__List_node_base._M_next;
  (this->current)._M_node = _Var1._M_node;
  _Var1 = std::next<std::_List_iterator<cmExpandedCommandArgument>>
                    (_Var1,(ulong)(_Var1._M_node != (_List_node_base *)args));
  (this->next)._M_node = _Var1._M_node;
  _Var1 = std::next<std::_List_iterator<cmExpandedCommandArgument>>
                    (_Var1,(ulong)(_Var1._M_node != (_List_node_base *)args));
  (this->nextnext)._M_node = _Var1._M_node;
  return;
}

Assistant:

CurrentAndTwoMoreIter(base_t& args)
      : current(args.begin())
      , next(
          std::next(this->current,
                    static_cast<difference_type>(this->current != args.end())))
      , nextnext(std::next(
          this->next, static_cast<difference_type>(this->next != args.end())))
    {
    }